

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_zip.c
# Opt level: O0

void copy_path(archive_entry *entry,uchar *p)

{
  mode_t mVar1;
  char *__s;
  size_t __n;
  mode_t type;
  size_t pathlen;
  char *path;
  uchar *p_local;
  archive_entry *entry_local;
  
  __s = archive_entry_pathname(entry);
  __n = strlen(__s);
  mVar1 = archive_entry_filetype(entry);
  memcpy(p,__s,__n);
  if (mVar1 == 0x4000 && __s[__n - 1] != '/') {
    p[__n] = '/';
    p[__n + 1] = '\0';
  }
  return;
}

Assistant:

static void
copy_path(struct archive_entry *entry, unsigned char *p)
{
	const char *path;
	size_t pathlen;
	mode_t type;

	path = archive_entry_pathname(entry);
	pathlen = strlen(path);
	type = archive_entry_filetype(entry);

	memcpy(p, path, pathlen);

	/* Folders are recognized by a trailing slash. */
	if ((type == AE_IFDIR) & (path[pathlen - 1] != '/')) {
		p[pathlen] = '/';
		p[pathlen + 1] = '\0';
	}
}